

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O2

MPP_RET h264e_vepu_mbrc_setup(HalH264eVepuMbRcCtx ctx,MppEncCfgSet *cfg)

{
  RK_S32 RVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_mbrc_setup");
  }
  iVar4 = (cfg->prep).width;
  *(int *)ctx = iVar4;
  iVar3 = (cfg->prep).height;
  *(int *)((long)ctx + 4) = iVar3;
  iVar5 = iVar4 + 0xf >> 4;
  *(int *)((long)ctx + 8) = iVar5;
  iVar6 = iVar3 + 0xf >> 4;
  *(int *)((long)ctx + 0xc) = iVar6;
  *(int *)((long)ctx + 0x10) = iVar3 * iVar4;
  *(int *)((long)ctx + 0x14) = iVar6 * iVar5;
  RVar1 = axb_div_c((cfg->rc).bps_target,(cfg->rc).fps_out_denom,(cfg->rc).fps_out_num);
  *(RK_S32 *)((long)ctx + 0x18) = RVar1;
  if (*(int *)((long)ctx + 0x10) == 0) {
    _mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->pels",
               "h264e_vepu_mbrc_setup",0x212);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00227137;
  }
  iVar4 = (cfg->rc).fps_out_num;
  iVar3 = (cfg->rc).fps_out_denom;
  iVar5 = (cfg->rc).fps_in_num;
  iVar6 = (cfg->rc).fps_in_denom;
  if (iVar5 / iVar6 < iVar4 / iVar3) {
    _mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,
               "rc->fps_out_num / rc->fps_out_denom <= rc->fps_in_num / rc->fps_in_denom",
               "h264e_vepu_mbrc_setup",0x215);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00227137:
      abort();
    }
    iVar5 = (cfg->rc).fps_in_num;
    iVar6 = (cfg->rc).fps_in_denom;
    iVar4 = (cfg->rc).fps_out_num;
    iVar3 = (cfg->rc).fps_out_denom;
  }
  *(int *)((long)ctx + 0x20) = iVar5;
  *(int *)((long)ctx + 0x24) = iVar6;
  *(int *)((long)ctx + 0x28) = iVar4;
  *(int *)((long)ctx + 0x2c) = iVar3;
  *(int *)((long)ctx + 0x34) = iVar4 * iVar6;
  *(int *)((long)ctx + 0x38) = iVar3 * iVar5;
  *(int *)((long)ctx + 0x30) = iVar3 * iVar5;
  uVar2 = 0;
  if ((cfg->hw).mb_rc_disable == 0) {
    uVar2 = (uint)((cfg->rc).rc_mode != MPP_ENC_RC_MODE_FIXQP);
  }
  *(uint *)((long)ctx + 0x1c) = uVar2;
  if ((hal_h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","estimated init qp %d\n","h264e_vepu_mbrc_setup",
               (ulong)*(uint *)((long)ctx + 0x4c));
    uVar2 = *(uint *)((long)ctx + 0x1c);
  }
  *(undefined8 *)((long)ctx + 0x3c) = 0x60000000002;
  if (uVar2 == 0) {
    iVar4 = 0;
    iVar3 = 0;
  }
  else {
    iVar4 = 10;
    if (*(int *)((long)ctx + 0xc) < 0xc) {
      iVar4 = *(int *)((long)ctx + 0xc) + -1;
    }
    iVar3 = *(int *)((long)ctx + 0x14) / (iVar4 + 1);
  }
  *(int *)((long)ctx + 0x44) = iVar4;
  *(int *)((long)ctx + 0x48) = iVar3;
  *(undefined8 *)((long)ctx + 0x50) = 0x200000002;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave\n","h264e_vepu_mbrc_setup");
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_mbrc_setup(HalH264eVepuMbRcCtx ctx, MppEncCfgSet*cfg)
{
    HalH264eVepuMbRcImpl *p = (HalH264eVepuMbRcImpl *)ctx;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncRcCfg *rc = &cfg->rc;
    MppEncHwCfg* hw_cfg = &cfg->hw;

    hal_h264e_dbg_func("enter\n");

    // get necessary parameter from config
    p->width    = prep->width;
    p->height   = prep->height;
    p->mb_w     = MPP_ALIGN(prep->width, 16) / 16;
    p->mb_h     = MPP_ALIGN(prep->height, 16) / 16;
    p->pels     = p->width * p->height;
    p->mbs      = p->mb_w * p->mb_h;
    p->bits_per_pic = axb_div_c(rc->bps_target, rc->fps_out_denom,
                                rc->fps_out_num);

    mpp_assert(p->pels);

    // frame rate control
    mpp_assert(rc->fps_out_num / rc->fps_out_denom <= rc->fps_in_num / rc->fps_in_denom);

    p->fps_in_num       = rc->fps_in_num;
    p->fps_in_denom    = rc->fps_in_denom;
    p->fps_out_num      = rc->fps_out_num;
    p->fps_out_denom   = rc->fps_out_denom;

    p->fps_step         = rc->fps_in_denom * rc->fps_out_num;
    p->fps_threshold    = rc->fps_in_num * rc->fps_out_denom;
    p->fps_count        = p->fps_threshold;

    // if not constant
    p->mb_bit_rc_enable = !hw_cfg->mb_rc_disable && (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP);

    hal_h264e_dbg_rc("estimated init qp %d\n", p->qp_init_est);

    // init first frame mad parameter
    p->mad_qp_change = 2;
    p->mad_threshold = 256 * 6;

    // init check point position
    if (p->mb_bit_rc_enable) {
        p->check_point_count = MPP_MIN(p->mb_h - 1, VEPU_CHECK_POINTS_MAX);
        p->check_point_distance = p->mbs / (p->check_point_count + 1);
    } else {
        p->check_point_count = 0;
        p->check_point_distance = 0;
    }

    p->frame_type = INTRA_FRAME;
    p->pre_frame_type = INTRA_FRAME;

    hal_h264e_dbg_func("leave\n");
    return MPP_OK;
}